

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O1

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  size_t outlen;
  size_t outlen_00;
  secp256k1_gej *psVar5;
  secp256k1_gej *psVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  uchar nonce32 [32];
  secp256k1_scalar b;
  uchar keydata [64];
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_gej gb;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  secp256k1_scalar local_198;
  secp256k1_fe local_178;
  uchar local_148 [32];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  int local_c8;
  secp256k1_gej local_b8;
  
  bVar7 = 0;
  if (seed32 == (uchar *)0x0) {
    (ctx->initial).infinity = 0;
    (ctx->initial).x.n[0] = 0x2815b16f81798;
    (ctx->initial).x.n[1] = 0xdb2dce28d959f;
    (ctx->initial).x.n[2] = 0xe870b07029bfc;
    (ctx->initial).x.n[3] = 0xbbac55a06295c;
    (ctx->initial).x.n[4] = 0x79be667ef9dc;
    (ctx->initial).y.n[0] = 0x7d08ffb10d4b8;
    (ctx->initial).y.n[1] = 0x48a68554199c4;
    (ctx->initial).y.n[2] = 0xe1108a8fd17b4;
    (ctx->initial).y.n[3] = 0xc4655da4fbfc0;
    (ctx->initial).y.n[4] = 0x483ada7726a3;
    (ctx->initial).z.n[0] = 1;
    (ctx->initial).z.n[1] = 0;
    (ctx->initial).z.n[2] = 0;
    (ctx->initial).z.n[3] = 0;
    (ctx->initial).z.n[4] = 0;
    secp256k1_gej_neg(&ctx->initial,&ctx->initial);
    (ctx->blind).d[0] = 1;
    (ctx->blind).d[1] = 0;
    (ctx->blind).d[2] = 0;
    (ctx->blind).d[3] = 0;
  }
  else {
    secp256k1_scalar_get_b32(local_148,&ctx->blind);
    local_128 = *(undefined8 *)seed32;
    uStack_120 = *(undefined8 *)(seed32 + 8);
    local_118 = *(undefined8 *)(seed32 + 0x10);
    uStack_110 = *(undefined8 *)(seed32 + 0x18);
    secp256k1_rfc6979_hmac_sha256_initialize
              ((secp256k1_rfc6979_hmac_sha256 *)local_108,local_148,0x40);
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_148[0x10] = '\0';
    local_148[0x11] = '\0';
    local_148[0x12] = '\0';
    local_148[0x13] = '\0';
    local_148[0x14] = '\0';
    local_148[0x15] = '\0';
    local_148[0x16] = '\0';
    local_148[0x17] = '\0';
    local_148[0x18] = '\0';
    local_148[0x19] = '\0';
    local_148[0x1a] = '\0';
    local_148[0x1b] = '\0';
    local_148[0x1c] = '\0';
    local_148[0x1d] = '\0';
    local_148[0x1e] = '\0';
    local_148[0x1f] = '\0';
    local_148[0] = '\0';
    local_148[1] = '\0';
    local_148[2] = '\0';
    local_148[3] = '\0';
    local_148[4] = '\0';
    local_148[5] = '\0';
    local_148[6] = '\0';
    local_148[7] = '\0';
    local_148[8] = '\0';
    local_148[9] = '\0';
    local_148[10] = '\0';
    local_148[0xb] = '\0';
    local_148[0xc] = '\0';
    local_148[0xd] = '\0';
    local_148[0xe] = '\0';
    local_148[0xf] = '\0';
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)local_108,local_1b8,outlen);
    secp256k1_fe_impl_set_b32_mod(&local_178,local_1b8);
    local_b8.x.n[0]._0_4_ = secp256k1_fe_impl_normalizes_to_zero(&local_178);
    uVar1 = (long)(int)(uint)local_b8.x.n[0] - 1;
    local_178.n[0] = (ulong)((uint)local_b8.x.n[0] & 1) | uVar1 & local_178.n[0];
    auVar8._8_4_ = (int)uVar1;
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = (int)(uVar1 >> 0x20);
    auVar2._8_8_ = local_178.n[2];
    auVar2._0_8_ = local_178.n[1];
    auVar3._8_8_ = local_178.n[4];
    auVar3._0_8_ = local_178.n[3];
    local_178.n[1] = SUB168(auVar2 & auVar8,0);
    local_178.n[2] = SUB168(auVar2 & auVar8,8);
    local_178.n[3] = SUB168(auVar3 & auVar8,0);
    local_178.n[4] = SUB168(auVar3 & auVar8,8);
    secp256k1_gej_rescale(&ctx->initial,&local_178);
    local_178.n[2] = 0;
    local_178.n[3] = 0;
    local_178.n[0] = 0;
    local_178.n[1] = 0;
    local_178.n[4] = 0;
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)local_108,local_1b8,outlen_00);
    secp256k1_scalar_set_b32(&local_198,local_1b8,(int *)0x0);
    local_b8.x.n[0]._0_4_ =
         (uint)(((local_198.d[1] == 0 && local_198.d[0] == 0) && local_198.d[2] == 0) &&
               local_198.d[3] == 0);
    uVar1 = (long)(int)(uint)local_b8.x.n[0] - 1;
    local_198.d[0] = (ulong)(uint)local_b8.x.n[0] | local_198.d[0] & uVar1;
    local_198.d[1] = local_198.d[1] & uVar1;
    local_198.d[2] = local_198.d[2] & uVar1;
    local_198.d[3] = uVar1 & local_198.d[3];
    local_108 = (undefined1  [16])0x0;
    local_f8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    local_c8 = 0;
    local_1b8 = (undefined1  [16])0x0;
    local_1a8 = (undefined1  [16])0x0;
    secp256k1_ecmult_gen(ctx,&local_b8,&local_198);
    secp256k1_scalar_negate(&local_198,&local_198);
    (ctx->blind).d[2] = local_198.d[2];
    (ctx->blind).d[3] = local_198.d[3];
    (ctx->blind).d[0] = local_198.d[0];
    (ctx->blind).d[1] = local_198.d[1];
    psVar5 = &local_b8;
    psVar6 = &ctx->initial;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (psVar6->x).n[0] = (psVar5->x).n[0];
      psVar5 = (secp256k1_gej *)((long)psVar5 + (ulong)bVar7 * -0x10 + 8);
      psVar6 = (secp256k1_gej *)((long)psVar6 + (ulong)bVar7 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_gej gb;
    secp256k1_fe s;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];
    if (seed32 == NULL) {
        /* When seed is NULL, reset the initial point and blinding value. */
        secp256k1_gej_set_ge(&ctx->initial, &secp256k1_ge_const_g);
        secp256k1_gej_neg(&ctx->initial, &ctx->initial);
        secp256k1_scalar_set_int(&ctx->blind, 1);
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->blind);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    memset(keydata, 0, sizeof(keydata));
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&s, nonce32);
    secp256k1_fe_cmov(&s, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&s));
    /* Randomize the projection to defend against multiplier sidechannels.
       Do this before our own call to secp256k1_ecmult_gen below. */
    secp256k1_gej_rescale(&ctx->initial, &s);
    secp256k1_fe_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* A blinding value of 0 works, but would undermine the projection hardening. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    memset(nonce32, 0, 32);
    /* The random projection in ctx->initial ensures that gb will have a random projection. */
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    ctx->blind = b;
    ctx->initial = gb;
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
}